

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSum.cpp
# Opt level: O3

void __thiscall NaPNSum::action(NaPNSum *this)

{
  NaVector *this_00;
  NaPetriCnOutput *pNVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  NaVector *pNVar9;
  NaReal *pNVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NaVector *pNVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  
  pNVar11 = &this->vMainGain;
  uVar6 = NaVector::dim(pNVar11);
  if (uVar6 != 0) {
    this_00 = &this->vAuxGain;
    uVar6 = NaVector::dim(this_00);
    if (uVar6 != 0) {
      uVar6 = NaVector::dim(pNVar11);
      if ((uVar6 != 1) && (uVar6 = NaVector::dim(this_00), uVar6 != 1)) {
        pNVar1 = &this->sum;
        pNVar9 = NaPetriCnOutput::data(pNVar1);
        iVar7 = (*pNVar9->_vptr_NaVector[6])(pNVar9);
        if (iVar7 == 0) {
          return;
        }
        uVar6 = 0;
        do {
          pNVar10 = NaVector::operator[](pNVar11,uVar6);
          dVar2 = *pNVar10;
          pNVar9 = NaPetriCnInput::data(&this->main);
          iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar6);
          dVar3 = *(double *)CONCAT44(extraout_var_05,iVar7);
          pNVar10 = NaVector::operator[](this_00,uVar6);
          dVar4 = *pNVar10;
          pNVar9 = NaPetriCnInput::data(&this->aux);
          iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar6);
          dVar5 = *(double *)CONCAT44(extraout_var_06,iVar7);
          pNVar9 = NaPetriCnOutput::data(pNVar1);
          iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar6);
          *(double *)CONCAT44(extraout_var_07,iVar7) = dVar4 * dVar5 + dVar2 * dVar3;
          uVar6 = uVar6 + 1;
          pNVar9 = NaPetriCnOutput::data(pNVar1);
          uVar8 = (*pNVar9->_vptr_NaVector[6])(pNVar9);
        } while (uVar6 < uVar8);
        return;
      }
      pNVar1 = &this->sum;
      pNVar9 = NaPetriCnOutput::data(pNVar1);
      iVar7 = (*pNVar9->_vptr_NaVector[6])(pNVar9);
      if (iVar7 == 0) {
        return;
      }
      uVar6 = 0;
      do {
        pNVar10 = NaVector::operator[](pNVar11,0);
        dVar2 = *pNVar10;
        pNVar9 = NaPetriCnInput::data(&this->main);
        iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9);
        dVar3 = *(double *)CONCAT44(extraout_var,iVar7);
        pNVar10 = NaVector::operator[](this_00,0);
        dVar4 = *pNVar10;
        pNVar9 = NaPetriCnInput::data(&this->aux);
        iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9,(ulong)uVar6);
        dVar5 = *(double *)CONCAT44(extraout_var_00,iVar7);
        pNVar9 = NaPetriCnOutput::data(pNVar1);
        iVar7 = (*pNVar9->_vptr_NaVector[8])(pNVar9);
        *(double *)CONCAT44(extraout_var_01,iVar7) = dVar4 * dVar5 + dVar2 * dVar3;
        uVar6 = uVar6 + 1;
        pNVar9 = NaPetriCnOutput::data(pNVar1);
        uVar8 = (*pNVar9->_vptr_NaVector[6])(pNVar9);
      } while (uVar6 < uVar8);
      return;
    }
  }
  pNVar1 = &this->sum;
  pNVar11 = NaPetriCnOutput::data(pNVar1);
  iVar7 = (*pNVar11->_vptr_NaVector[6])(pNVar11);
  if (iVar7 != 0) {
    uVar6 = 0;
    do {
      pNVar11 = NaPetriCnInput::data(&this->main);
      iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar6);
      dVar2 = *(double *)CONCAT44(extraout_var_02,iVar7);
      pNVar11 = NaPetriCnInput::data(&this->aux);
      iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar6);
      dVar3 = *(double *)CONCAT44(extraout_var_03,iVar7);
      pNVar11 = NaPetriCnOutput::data(pNVar1);
      iVar7 = (*pNVar11->_vptr_NaVector[8])(pNVar11,(ulong)uVar6);
      *(double *)CONCAT44(extraout_var_04,iVar7) = dVar2 + dVar3;
      uVar6 = uVar6 + 1;
      pNVar11 = NaPetriCnOutput::data(pNVar1);
      uVar8 = (*pNVar11->_vptr_NaVector[6])(pNVar11);
    } while (uVar6 < uVar8);
  }
  return;
}

Assistant:

void
NaPNSum::action ()
{
    unsigned    i;

    if(0 == vMainGain.dim() || 0 == vAuxGain.dim())
      {
	/* vMainGain[i]=1 and vAuxGain[i]=1 by default */
	for(i = 0; i < sum.data().dim(); ++i)
	  sum.data()[i] = main.data()[i] + aux.data()[i];
      }
    else if(1 == vMainGain.dim() || 1 == vAuxGain.dim())
      {
	/* vMainGain[0]=k1 and vAuxGain[0]=k2 by default */
	for(i = 0; i < sum.data().dim(); ++i)
	  sum.data()[i] =
	    vMainGain[0] * main.data()[i]
	    + vAuxGain[0] * aux.data()[i];
      }
    else
      {
	for(i = 0; i < sum.data().dim(); ++i)
	  sum.data()[i] =
	    vMainGain[i] * main.data()[i]
	    + vAuxGain[i] * aux.data()[i];
      }
}